

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QList<QPointer<QWidget>_> * __thiscall QMenuPrivate::calcCausedStack(QMenuPrivate *this)

{
  long lVar1;
  QTornOffMenu *pQVar2;
  QMenu *pQVar3;
  QList<QPointer<QWidget>_> *in_RDI;
  long in_FS_OFFSET;
  QMenu *qmenu;
  QTornOffMenu *qtmenu;
  QWidget *widget;
  QList<QPointer<QWidget>_> *ret;
  QWidget *in_stack_ffffffffffffff98;
  QList<QPointer<QWidget>_> *this_00;
  QWidget *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QPointer<QWidget> *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QPointer<QWidget>_>::QList((QList<QPointer<QWidget>_> *)0x63f601);
  local_38 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x63f612);
  while (local_38 != (QWidget *)0x0) {
    QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)this_00,in_stack_ffffffffffffff98);
    QList<QPointer<QWidget>_>::append(this_00,(rvalue_ref)in_stack_ffffffffffffff98);
    QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x63f64b);
    pQVar2 = qobject_cast<QTornOffMenu*>((QObject *)0x63f655);
    if (pQVar2 != (QTornOffMenu *)0x0) {
      QTornOffMenu::d_func((QTornOffMenu *)0x63f66c);
      QList<QPointer<QWidget>_>::operator+=
                (this_00,(QList<QPointer<QWidget>_> *)in_stack_ffffffffffffff98);
    }
    pQVar3 = qobject_cast<QMenu*>((QObject *)0x63f68a);
    if (pQVar3 == (QMenu *)0x0) break;
    QMenu::d_func((QMenu *)0x63f6a1);
    local_38 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x63f6b0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPointer<QWidget>> QMenuPrivate::calcCausedStack() const
{
    QList<QPointer<QWidget>> ret;
    for(QWidget *widget = causedPopup.widget; widget; ) {
        ret.append(widget);
        if (QTornOffMenu *qtmenu = qobject_cast<QTornOffMenu*>(widget))
            ret += qtmenu->d_func()->causedStack;
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget))
            widget = qmenu->d_func()->causedPopup.widget;
        else
            break;
    }
    return ret;
}